

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlStrncmp(void)

{
  int iVar1;
  int iVar2;
  int val;
  xmlChar *val_00;
  xmlChar *val_01;
  size_t sVar3;
  int local_3c;
  int n_len;
  int len;
  int n_str2;
  xmlChar *str2;
  int n_str1;
  xmlChar *str1;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (str2._4_4_ = 0; (int)str2._4_4_ < 5; str2._4_4_ = str2._4_4_ + 1) {
    for (n_len = 0; n_len < 5; n_len = n_len + 1) {
      for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
        iVar1 = xmlMemBlocks();
        val_00 = gen_const_xmlChar_ptr(str2._4_4_,0);
        val_01 = gen_const_xmlChar_ptr(n_len,1);
        iVar2 = gen_int(local_3c,2);
        if ((val_01 == (xmlChar *)0x0) || (sVar3 = strlen((char *)val_01), iVar2 <= (int)sVar3 + 1))
        {
          val = xmlStrncmp(val_00,val_01,iVar2);
          desret_int(val);
          call_tests = call_tests + 1;
          des_const_xmlChar_ptr(str2._4_4_,val_00,0);
          des_const_xmlChar_ptr(n_len,val_01,1);
          des_int(local_3c,iVar2,2);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlStrncmp",(ulong)(uint)(iVar2 - iVar1));
            ret_val = ret_val + 1;
            printf(" %d",(ulong)str2._4_4_);
            printf(" %d",(ulong)(uint)n_len);
            printf(" %d");
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlStrncmp(void) {
    int test_ret = 0;

    int mem_base;
    int ret_val;
    xmlChar * str1; /* the first xmlChar * */
    int n_str1;
    xmlChar * str2; /* the second xmlChar * */
    int n_str2;
    int len; /* the max comparison length */
    int n_len;

    for (n_str1 = 0;n_str1 < gen_nb_const_xmlChar_ptr;n_str1++) {
    for (n_str2 = 0;n_str2 < gen_nb_const_xmlChar_ptr;n_str2++) {
    for (n_len = 0;n_len < gen_nb_int;n_len++) {
        mem_base = xmlMemBlocks();
        str1 = gen_const_xmlChar_ptr(n_str1, 0);
        str2 = gen_const_xmlChar_ptr(n_str2, 1);
        len = gen_int(n_len, 2);
        if ((str2 != NULL) &&
            (len > (int) strlen((const char *) str2) + 1))
            continue;

        ret_val = xmlStrncmp((const xmlChar *)str1, (const xmlChar *)str2, len);
        desret_int(ret_val);
        call_tests++;
        des_const_xmlChar_ptr(n_str1, (const xmlChar *)str1, 0);
        des_const_xmlChar_ptr(n_str2, (const xmlChar *)str2, 1);
        des_int(n_len, len, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlStrncmp",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_str1);
            printf(" %d", n_str2);
            printf(" %d", n_len);
            printf("\n");
        }
    }
    }
    }
    function_tests++;

    return(test_ret);
}